

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall flatbuffers::rust::RustGenerator::SetNameSpace(RustGenerator *this,Namespace *ns)

{
  CodeWriter *this_00;
  Namespace *pNVar1;
  __type _Var2;
  ulong uVar3;
  long lVar4;
  size_t j;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong local_138;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pNVar1 = this->cur_name_space_;
  if (pNVar1 != ns) {
    if (pNVar1 == (Namespace *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (long)(pNVar1->components).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pNVar1->components).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    if (ns == (Namespace *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (long)(ns->components).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(ns->components).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    uVar6 = uVar3;
    if (uVar5 < uVar3) {
      uVar6 = uVar5;
    }
    lVar4 = 0;
    uVar7 = 0;
    while ((local_138 = uVar6, uVar6 != uVar7 &&
           (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&(((ns->components).
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar4),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&(((this->cur_name_space_->components).
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar4)), local_138 = uVar7, _Var2
           ))) {
      uVar7 = uVar7 + 1;
      lVar4 = lVar4 + 0x20;
    }
    this_00 = &this->code_;
    lVar4 = uVar5 << 5;
    for (uVar6 = uVar5; local_138 < uVar6; uVar6 = uVar6 - 1) {
      std::operator+(&local_50,"}  // pub mod ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(this->cur_name_space_->components).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p + lVar4)
                    );
      CodeWriter::operator+=(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      lVar4 = lVar4 + -0x20;
    }
    if (uVar5 != local_138) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"",(allocator<char> *)&local_f0);
      CodeWriter::operator+=(this_00,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    lVar4 = local_138 << 5;
    for (uVar5 = uVar3; local_138 != uVar5; uVar5 = uVar5 - 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"#[allow(unused_imports, dead_code)]",
                 (allocator<char> *)&local_f0);
      CodeWriter::operator+=(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (&local_b0,&this->namer_,
                 (long)&(((ns->components).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4,
                 (ulong)(this->namer_).super_Namer.config_.namespaces);
      std::operator+(&local_f0,"pub mod ",&local_b0);
      std::operator+(&local_90,&local_f0," {");
      CodeWriter::operator+=(this_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_b0);
      GenNamespaceImports(this,2);
      lVar4 = lVar4 + 0x20;
    }
    if (uVar3 != local_138) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"",(allocator<char> *)&local_f0);
      CodeWriter::operator+=(this_00,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    this->cur_name_space_ = ns;
  }
  return;
}

Assistant:

void SetNameSpace(const Namespace *ns) {
    if (cur_name_space_ == ns) { return; }

    // Compute the size of the longest common namespace prefix.
    // If cur_name_space is A::B::C::D and ns is A::B::E::F::G,
    // the common prefix is A::B:: and we have old_size = 4, new_size = 5
    // and common_prefix_size = 2
    size_t old_size = cur_name_space_ ? cur_name_space_->components.size() : 0;
    size_t new_size = ns ? ns->components.size() : 0;

    size_t common_prefix_size = 0;
    while (common_prefix_size < old_size && common_prefix_size < new_size &&
           ns->components[common_prefix_size] ==
               cur_name_space_->components[common_prefix_size]) {
      common_prefix_size++;
    }

    // Close cur_name_space in reverse order to reach the common prefix.
    // In the previous example, D then C are closed.
    for (size_t j = old_size; j > common_prefix_size; --j) {
      code_ += "}  // pub mod " + cur_name_space_->components[j - 1];
    }
    if (old_size != common_prefix_size) { code_ += ""; }

    // open namespace parts to reach the ns namespace
    // in the previous example, E, then F, then G are opened
    for (auto j = common_prefix_size; j != new_size; ++j) {
      code_ += "#[allow(unused_imports, dead_code)]";
      code_ += "pub mod " + namer_.Namespace(ns->components[j]) + " {";
      // Generate local namespace imports.
      GenNamespaceImports(2);
    }
    if (new_size != common_prefix_size) { code_ += ""; }

    cur_name_space_ = ns;
  }